

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
          (InternalMetadata *this,UnknownFieldSet *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  UnknownFieldSet *this_00;
  
  if ((this->ptr_ & 1U) == 0) {
    this_00 = mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this);
  }
  else {
    this_00 = (UnknownFieldSet *)((this->ptr_ & 0xfffffffffffffffeU) + 8);
  }
  pAVar1 = UnknownFieldSet::arena(this_00);
  pAVar2 = UnknownFieldSet::arena(other);
  if (pAVar1 != pAVar2) {
    UnknownFieldSet::SwapSlow(this_00,other);
    return;
  }
  RepeatedField<google::protobuf::UnknownField>::Swap(&this_00->fields_,&other->fields_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void DoSwap(T* other) {
    mutable_unknown_fields<T>()->Swap(other);
  }